

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mersenne_twister.h
# Opt level: O3

void __thiscall
dlib::random_helpers::
mersenne_twister<unsigned_int,_32,_624,_397,_31,_2567483615U,_11,_7,_2636928640U,_15,_4022730752U,_18,_3346425566U>
::twist(mersenne_twister<unsigned_int,_32,_624,_397,_31,_2567483615U,_11,_7,_2636928640U,_15,_4022730752U,_18,_3346425566U>
        *this,int block)

{
  uint uVar1;
  bool bVar2;
  undefined8 uVar3;
  byte bVar4;
  byte bVar5;
  long lVar6;
  ushort uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar10 [16];
  undefined1 auVar13 [16];
  
  if (block == 0) {
    uVar1 = this->x[0];
    auVar12._4_4_ = uVar1;
    auVar12._0_4_ = uVar1;
    auVar12._8_4_ = uVar1;
    auVar12._12_4_ = uVar1;
    auVar9._8_4_ = 0x7ffffffe;
    auVar9._0_8_ = 0x7ffffffe7ffffffe;
    auVar9._12_4_ = 0x7ffffffe;
    auVar10._8_4_ = 0x80000000;
    auVar10._0_8_ = 0x8000000080000000;
    auVar10._12_4_ = 0x80000000;
    auVar29._8_4_ = 1;
    auVar29._0_8_ = 0x100000001;
    auVar29._12_4_ = 1;
    auVar31._8_4_ = 0x9908b0df;
    auVar31._0_8_ = 0x9908b0df9908b0df;
    auVar31._12_4_ = 0x9908b0df;
    lVar6 = -0x270;
    do {
      auVar32 = *(undefined1 (*) [16])(this->x + lVar6 + 0x271);
      auVar12 = vpalignr_avx(auVar32,auVar12,0xc);
      auVar14 = vpand_avx(auVar32,auVar9);
      uVar8 = vptestmd_avx512vl(auVar32,auVar29);
      uVar8 = uVar8 & 0xf;
      auVar12 = vpternlogd_avx512vl(auVar14,auVar12,auVar10,0xf8);
      auVar12 = vpsrld_avx(auVar12,1);
      auVar12 = auVar12 ^ *(undefined1 (*) [16])(this->x + lVar6 + 0x3fd);
      auVar13 = vpxord_avx512vl(auVar12,auVar31);
      bVar2 = (bool)((byte)uVar8 & 1);
      auVar14._0_4_ = (uint)bVar2 * auVar13._0_4_ | (uint)!bVar2 * auVar12._0_4_;
      bVar2 = (bool)((byte)(uVar8 >> 1) & 1);
      auVar14._4_4_ = (uint)bVar2 * auVar13._4_4_ | (uint)!bVar2 * auVar12._4_4_;
      bVar2 = (bool)((byte)(uVar8 >> 2) & 1);
      auVar14._8_4_ = (uint)bVar2 * auVar13._8_4_ | (uint)!bVar2 * auVar12._8_4_;
      bVar2 = SUB81(uVar8 >> 3,0);
      auVar14._12_4_ = (uint)bVar2 * auVar13._12_4_ | (uint)!bVar2 * auVar12._12_4_;
      *(undefined1 (*) [16])(&this->i + lVar6) = auVar14;
      lVar6 = lVar6 + 4;
      auVar12 = auVar32;
    } while (lVar6 != 0);
  }
  else if (block == 1) {
    auVar15 = vpbroadcastd_avx512f(ZEXT416(this->x[0x270]));
    auVar16 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar18 = vpbroadcastq_avx512f(ZEXT816(0xe3));
    auVar19 = vpbroadcastd_avx512f(ZEXT416(0x7ffffffe));
    auVar20 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
    auVar21 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar22 = vpbroadcastd_avx512f(ZEXT416(0x9908b0df));
    lVar6 = 0;
    do {
      auVar23 = vpbroadcastq_avx512f();
      auVar24 = vporq_avx512f(auVar23,auVar16);
      auVar23 = vporq_avx512f(auVar23,auVar17);
      uVar3 = vpcmpuq_avx512f(auVar23,auVar18,1);
      bVar4 = (byte)uVar3;
      uVar3 = vpcmpuq_avx512f(auVar24,auVar18,1);
      bVar5 = (byte)uVar3;
      uVar7 = CONCAT11(bVar5,bVar4);
      auVar23 = vmovdqu32_avx512f(*(undefined1 (*) [64])(this->x + lVar6 + 0x271));
      auVar24._4_4_ = (uint)((byte)(uVar7 >> 1) & 1) * auVar23._4_4_;
      auVar24._0_4_ = (uint)(bVar4 & 1) * auVar23._0_4_;
      auVar24._8_4_ = (uint)((byte)(uVar7 >> 2) & 1) * auVar23._8_4_;
      auVar24._12_4_ = (uint)((byte)(uVar7 >> 3) & 1) * auVar23._12_4_;
      auVar24._16_4_ = (uint)((byte)(uVar7 >> 4) & 1) * auVar23._16_4_;
      auVar24._20_4_ = (uint)((byte)(uVar7 >> 5) & 1) * auVar23._20_4_;
      auVar24._24_4_ = (uint)((byte)(uVar7 >> 6) & 1) * auVar23._24_4_;
      auVar24._28_4_ = (uint)((byte)(uVar7 >> 7) & 1) * auVar23._28_4_;
      auVar24._32_4_ = (uint)(bVar5 & 1) * auVar23._32_4_;
      auVar24._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar23._36_4_;
      auVar24._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar23._40_4_;
      auVar24._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar23._44_4_;
      auVar24._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar23._48_4_;
      auVar24._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar23._52_4_;
      auVar24._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar23._56_4_;
      auVar24._60_4_ = (uint)(bVar5 >> 7) * auVar23._60_4_;
      auVar23 = vmovdqu32_avx512f(*(undefined1 (*) [64])(this->x + lVar6 + 0x3fd));
      auVar25._4_4_ = (uint)((byte)(uVar7 >> 1) & 1) * auVar23._4_4_;
      auVar25._0_4_ = (uint)(bVar4 & 1) * auVar23._0_4_;
      auVar25._8_4_ = (uint)((byte)(uVar7 >> 2) & 1) * auVar23._8_4_;
      auVar25._12_4_ = (uint)((byte)(uVar7 >> 3) & 1) * auVar23._12_4_;
      auVar25._16_4_ = (uint)((byte)(uVar7 >> 4) & 1) * auVar23._16_4_;
      auVar25._20_4_ = (uint)((byte)(uVar7 >> 5) & 1) * auVar23._20_4_;
      auVar25._24_4_ = (uint)((byte)(uVar7 >> 6) & 1) * auVar23._24_4_;
      auVar25._28_4_ = (uint)((byte)(uVar7 >> 7) & 1) * auVar23._28_4_;
      auVar25._32_4_ = (uint)(bVar5 & 1) * auVar23._32_4_;
      auVar25._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar23._36_4_;
      auVar25._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar23._40_4_;
      auVar25._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar23._44_4_;
      auVar25._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar23._48_4_;
      auVar25._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar23._52_4_;
      auVar25._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar23._56_4_;
      auVar25._60_4_ = (uint)(bVar5 >> 7) * auVar23._60_4_;
      auVar15 = valignd_avx512f(auVar24,auVar15,0xf);
      auVar23 = vpandd_avx512f(auVar24,auVar19);
      uVar8 = vptestmd_avx512f(auVar24,auVar21);
      auVar15 = vpternlogd_avx512f(auVar23,auVar15,auVar20,0xf8);
      auVar15 = vpsrld_avx512f(auVar15,1);
      auVar15 = vpxord_avx512f(auVar15,auVar25);
      auVar23 = vpxord_avx512f(auVar15,auVar22);
      bVar2 = (bool)((byte)uVar8 & 1);
      auVar26._0_4_ = (uint)bVar2 * auVar23._0_4_ | (uint)!bVar2 * auVar15._0_4_;
      bVar2 = (bool)((byte)(uVar8 >> 1) & 1);
      auVar26._4_4_ = (uint)bVar2 * auVar23._4_4_ | (uint)!bVar2 * auVar15._4_4_;
      bVar2 = (bool)((byte)(uVar8 >> 2) & 1);
      auVar26._8_4_ = (uint)bVar2 * auVar23._8_4_ | (uint)!bVar2 * auVar15._8_4_;
      bVar2 = (bool)((byte)(uVar8 >> 3) & 1);
      auVar26._12_4_ = (uint)bVar2 * auVar23._12_4_ | (uint)!bVar2 * auVar15._12_4_;
      bVar2 = (bool)((byte)(uVar8 >> 4) & 1);
      auVar26._16_4_ = (uint)bVar2 * auVar23._16_4_ | (uint)!bVar2 * auVar15._16_4_;
      bVar2 = (bool)((byte)(uVar8 >> 5) & 1);
      auVar26._20_4_ = (uint)bVar2 * auVar23._20_4_ | (uint)!bVar2 * auVar15._20_4_;
      bVar2 = (bool)((byte)(uVar8 >> 6) & 1);
      auVar26._24_4_ = (uint)bVar2 * auVar23._24_4_ | (uint)!bVar2 * auVar15._24_4_;
      bVar2 = (bool)((byte)(uVar8 >> 7) & 1);
      auVar26._28_4_ = (uint)bVar2 * auVar23._28_4_ | (uint)!bVar2 * auVar15._28_4_;
      bVar2 = (bool)((byte)(uVar8 >> 8) & 1);
      auVar26._32_4_ = (uint)bVar2 * auVar23._32_4_ | (uint)!bVar2 * auVar15._32_4_;
      bVar2 = (bool)((byte)(uVar8 >> 9) & 1);
      auVar26._36_4_ = (uint)bVar2 * auVar23._36_4_ | (uint)!bVar2 * auVar15._36_4_;
      bVar2 = (bool)((byte)(uVar8 >> 10) & 1);
      auVar26._40_4_ = (uint)bVar2 * auVar23._40_4_ | (uint)!bVar2 * auVar15._40_4_;
      bVar2 = (bool)((byte)(uVar8 >> 0xb) & 1);
      auVar26._44_4_ = (uint)bVar2 * auVar23._44_4_ | (uint)!bVar2 * auVar15._44_4_;
      bVar2 = (bool)((byte)(uVar8 >> 0xc) & 1);
      auVar26._48_4_ = (uint)bVar2 * auVar23._48_4_ | (uint)!bVar2 * auVar15._48_4_;
      bVar2 = (bool)((byte)(uVar8 >> 0xd) & 1);
      auVar26._52_4_ = (uint)bVar2 * auVar23._52_4_ | (uint)!bVar2 * auVar15._52_4_;
      bVar2 = (bool)((byte)(uVar8 >> 0xe) & 1);
      auVar26._56_4_ = (uint)bVar2 * auVar23._56_4_ | (uint)!bVar2 * auVar15._56_4_;
      bVar2 = SUB81(uVar8 >> 0xf,0);
      auVar26._60_4_ = (uint)bVar2 * auVar23._60_4_ | (uint)!bVar2 * auVar15._60_4_;
      auVar15 = vmovdqu32_avx512f(auVar26);
      *(undefined1 (*) [64])(this->x + lVar6) = auVar15;
      lVar6 = lVar6 + 0x10;
      auVar15 = vmovdqa64_avx512f(auVar24);
    } while (lVar6 != 0xf0);
    uVar1 = this->x[0x353];
    auVar32._4_4_ = uVar1;
    auVar32._0_4_ = uVar1;
    auVar32._8_4_ = uVar1;
    auVar32._12_4_ = uVar1;
    auVar13._8_4_ = 0x7ffffffe;
    auVar13._0_8_ = 0x7ffffffe7ffffffe;
    auVar13._12_4_ = 0x7ffffffe;
    auVar27._8_4_ = 0x80000000;
    auVar27._0_8_ = 0x8000000080000000;
    auVar27._12_4_ = 0x80000000;
    auVar28._8_4_ = 1;
    auVar28._0_8_ = 0x100000001;
    auVar28._12_4_ = 1;
    auVar30._8_4_ = 0x9908b0df;
    auVar30._0_8_ = 0x9908b0df9908b0df;
    auVar30._12_4_ = 0x9908b0df;
    lVar6 = 0;
    do {
      auVar12 = *(undefined1 (*) [16])(this->x + lVar6 + 0x354);
      auVar9 = vpalignr_avx(auVar12,auVar32,0xc);
      auVar10 = vpand_avx(auVar12,auVar13);
      uVar8 = vptestmd_avx512vl(auVar12,auVar28);
      uVar8 = uVar8 & 0xf;
      auVar9 = vpternlogd_avx512vl(auVar10,auVar9,auVar27,0xf8);
      auVar9 = vpsrld_avx(auVar9,1);
      auVar9 = auVar9 ^ *(undefined1 (*) [16])(this->x + lVar6);
      auVar10 = vpxord_avx512vl(auVar9,auVar30);
      bVar2 = (bool)((byte)uVar8 & 1);
      auVar11._0_4_ = (uint)bVar2 * auVar10._0_4_ | (uint)!bVar2 * auVar9._0_4_;
      bVar2 = (bool)((byte)(uVar8 >> 1) & 1);
      auVar11._4_4_ = (uint)bVar2 * auVar10._4_4_ | (uint)!bVar2 * auVar9._4_4_;
      bVar2 = (bool)((byte)(uVar8 >> 2) & 1);
      auVar11._8_4_ = (uint)bVar2 * auVar10._8_4_ | (uint)!bVar2 * auVar9._8_4_;
      bVar2 = SUB81(uVar8 >> 3,0);
      auVar11._12_4_ = (uint)bVar2 * auVar10._12_4_ | (uint)!bVar2 * auVar9._12_4_;
      *(undefined1 (*) [16])(this->x + lVar6 + 0xe3) = auVar11;
      lVar6 = lVar6 + 4;
      auVar32 = auVar12;
    } while (lVar6 != 0x18c);
    this->x[0x26f] =
         -(this->x[0] & 1) & 0x9908b0df ^
         (this->x[0] & 0x7ffffffe | this->x[0x4df] & 0x80000000) >> 1 ^ this->x[0x18c];
    this->i = 0;
    return;
  }
  return;
}

Assistant:

void mersenne_twister<UIntType,w,n,m,r,a,u,s,b,t,c,l,val>::twist(
            int block
        )
        {
            const UIntType upper_mask = (~0u) << r;
            const UIntType lower_mask = ~upper_mask;

            if(block == 0) {
                for(int j = n; j < 2*n; j++) {
                    UIntType y = (x[j-n] & upper_mask) | (x[j-(n-1)] & lower_mask);
                    x[j] = x[j-(n-m)] ^ (y >> 1) ^ (y&1 ? a : 0);
                }
            } else if (block == 1) {
                // split loop to avoid costly modulo operations
                {  // extra scope for MSVC brokenness w.r.t. for scope
                    for(int j = 0; j < n-m; j++) {
                        UIntType y = (x[j+n] & upper_mask) | (x[j+n+1] & lower_mask);
                        x[j] = x[j+n+m] ^ (y >> 1) ^ (y&1 ? a : 0);
                    }
                }

                for(int j = n-m; j < n-1; j++) {
                    UIntType y = (x[j+n] & upper_mask) | (x[j+n+1] & lower_mask);
                    x[j] = x[j-(n-m)] ^ (y >> 1) ^ (y&1 ? a : 0);
                }
                // last iteration
                UIntType y = (x[2*n-1] & upper_mask) | (x[0] & lower_mask);
                x[n-1] = x[m-1] ^ (y >> 1) ^ (y&1 ? a : 0);
                i = 0;
            }
        }